

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::QueryLinuxMemory(SystemInformationImplementation *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *__stream;
  int local_674;
  int status;
  char *r;
  unsigned_long buffersMem;
  unsigned_long cachedMem;
  unsigned_long temp;
  int i;
  int count;
  unsigned_long value [6];
  byte local_60e [6];
  bool have [6];
  char *format [6];
  FILE *fd;
  char minorChar;
  char majorChar;
  int errorFlag;
  utsname unameInfo;
  int linuxMinor;
  int linuxMajor;
  char buffer [1024];
  unsigned_long ap;
  unsigned_long av;
  unsigned_long tp;
  unsigned_long tv;
  SystemInformationImplementation *this_local;
  
  tp = 0;
  av = 0;
  ap = 0;
  buffer[0x3f8] = '\0';
  buffer[0x3f9] = '\0';
  buffer[0x3fa] = '\0';
  buffer[0x3fb] = '\0';
  buffer[0x3fc] = '\0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  unameInfo.domainname[0x3d] = '\0';
  unameInfo.domainname[0x3e] = '\0';
  unameInfo.domainname[0x3f] = '\0';
  unameInfo.domainname[0x40] = '\0';
  unameInfo.domainname[0x39] = '\0';
  unameInfo.domainname[0x3a] = '\0';
  unameInfo.domainname[0x3b] = '\0';
  unameInfo.domainname[0x3c] = '\0';
  tv = (unsigned_long)this;
  iVar1 = uname((utsname *)&minorChar);
  if (iVar1 == 0) {
    sVar5 = strlen(unameInfo.nodename + 0x39);
    if (2 < sVar5) {
      iVar1 = isdigit((int)unameInfo.nodename[0x39]);
      if (iVar1 != 0) {
        unameInfo.domainname._61_4_ = unameInfo.nodename[0x39] + -0x30;
      }
      iVar1 = isdigit((int)unameInfo.nodename[0x3b]);
      if (iVar1 != 0) {
        unameInfo.domainname._57_4_ = unameInfo.nodename[0x3b] + -0x30;
      }
    }
    __stream = fopen64("/proc/meminfo","r");
    if (__stream == (FILE *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/meminfo");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      if (((int)unameInfo.domainname._61_4_ < 3) &&
         (((int)unameInfo.domainname._61_4_ < 2 || ((int)unameInfo.domainname._57_4_ < 6)))) {
        piVar3 = (int *)fgets((char *)&linuxMinor,0x400,__stream);
        local_674 = 0;
        if (piVar3 == &linuxMinor) {
          local_674 = __isoc99_fscanf(__stream,"Mem: %lu %lu %lu %lu %lu %lu\n",&av,&cachedMem,
                                      buffer + 0x3f8,&cachedMem,&r,&buffersMem);
        }
        if (local_674 == 6) {
          local_674 = __isoc99_fscanf(__stream,"Swap: %lu %lu %lu\n",&tp,&cachedMem,&ap);
          local_674 = local_674 + 6;
        }
        if (local_674 != 9) {
          poVar2 = std::operator<<((ostream *)&std::cout,"Problem parsing /proc/meminfo");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          fclose(__stream);
          return false;
        }
        this->TotalVirtualMemory = tp >> 0x14;
        this->TotalPhysicalMemory = av >> 0x14;
        this->AvailableVirtualMemory = ap >> 0x14;
        this->AvailablePhysicalMemory = (ulong)(r + buffersMem + buffer._1016_8_) >> 0x14;
      }
      else {
        memcpy(&stack0xfffffffffffff9f8,&PTR_anon_var_dwarf_91439b_00bf42c0,0x30);
        memset(local_60e,0,6);
        temp._4_4_ = 0;
        while (pcVar4 = fgets((char *)&linuxMinor,0x400,__stream), pcVar4 != (char *)0x0) {
          for (temp._0_4_ = 0; (int)temp < 6; temp._0_4_ = (int)temp + 1) {
            if (((local_60e[(int)temp] & 1) == 0) &&
               (iVar1 = __isoc99_sscanf(&linuxMinor,
                                        *(undefined8 *)
                                         (&stack0xfffffffffffff9f8 + (long)(int)temp * 8),
                                        &i + (long)(int)temp * 2), iVar1 == 1)) {
              local_60e[(int)temp] = 1;
              temp._4_4_ = temp._4_4_ + 1;
            }
          }
        }
        if (temp._4_4_ != 6) {
          poVar2 = std::operator<<((ostream *)&std::cout,"Problem parsing /proc/meminfo");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          fclose(__stream);
          return false;
        }
        this->TotalPhysicalMemory = _i >> 10;
        this->AvailablePhysicalMemory = value[0] + value[1] + value[2] >> 10;
        this->TotalVirtualMemory = value[3] >> 10;
        this->AvailableVirtualMemory = value[4] >> 10;
      }
      fclose(__stream);
      this_local._7_1_ = true;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Problem calling uname(): ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SystemInformationImplementation::QueryLinuxMemory()
{
#if defined(__linux)
  unsigned long tv = 0;
  unsigned long tp = 0;
  unsigned long av = 0;
  unsigned long ap = 0;

  char buffer[1024]; // for reading lines

  int linuxMajor = 0;
  int linuxMinor = 0;

  // Find the Linux kernel version first
  struct utsname unameInfo;
  int errorFlag = uname(&unameInfo);
  if (errorFlag != 0) {
    std::cout << "Problem calling uname(): " << strerror(errno) << std::endl;
    return false;
  }

  if (strlen(unameInfo.release) >= 3) {
    // release looks like "2.6.3-15mdk-i686-up-4GB"
    char majorChar = unameInfo.release[0];
    char minorChar = unameInfo.release[2];

    if (isdigit(majorChar)) {
      linuxMajor = majorChar - '0';
    }

    if (isdigit(minorChar)) {
      linuxMinor = minorChar - '0';
    }
  }

  FILE* fd = fopen("/proc/meminfo", "r");
  if (!fd) {
    std::cout << "Problem opening /proc/meminfo" << std::endl;
    return false;
  }

  if (linuxMajor >= 3 || ((linuxMajor >= 2) && (linuxMinor >= 6))) {
    // new /proc/meminfo format since kernel 2.6.x
    // Rigorously, this test should check from the developping version 2.5.x
    // that introduced the new format...

    enum
    {
      mMemTotal,
      mMemFree,
      mBuffers,
      mCached,
      mSwapTotal,
      mSwapFree
    };
    const char* format[6] = { "MemTotal:%lu kB",  "MemFree:%lu kB",
                              "Buffers:%lu kB",   "Cached:%lu kB",
                              "SwapTotal:%lu kB", "SwapFree:%lu kB" };
    bool have[6] = { false, false, false, false, false, false };
    unsigned long value[6];
    int count = 0;
    while (fgets(buffer, static_cast<int>(sizeof(buffer)), fd)) {
      for (int i = 0; i < 6; ++i) {
        if (!have[i] && sscanf(buffer, format[i], &value[i]) == 1) {
          have[i] = true;
          ++count;
        }
      }
    }
    if (count == 6) {
      this->TotalPhysicalMemory = value[mMemTotal] / 1024;
      this->AvailablePhysicalMemory =
        (value[mMemFree] + value[mBuffers] + value[mCached]) / 1024;
      this->TotalVirtualMemory = value[mSwapTotal] / 1024;
      this->AvailableVirtualMemory = value[mSwapFree] / 1024;
    } else {
      std::cout << "Problem parsing /proc/meminfo" << std::endl;
      fclose(fd);
      return false;
    }
  } else {
    // /proc/meminfo format for kernel older than 2.6.x

    unsigned long temp;
    unsigned long cachedMem;
    unsigned long buffersMem;
    // Skip "total: used:..."
    char* r = fgets(buffer, static_cast<int>(sizeof(buffer)), fd);
    int status = 0;
    if (r == buffer) {
      status += fscanf(fd, "Mem: %lu %lu %lu %lu %lu %lu\n", &tp, &temp, &ap,
                       &temp, &buffersMem, &cachedMem);
    }
    if (status == 6) {
      status += fscanf(fd, "Swap: %lu %lu %lu\n", &tv, &temp, &av);
    }
    if (status == 9) {
      this->TotalVirtualMemory = tv >> 10 >> 10;
      this->TotalPhysicalMemory = tp >> 10 >> 10;
      this->AvailableVirtualMemory = av >> 10 >> 10;
      this->AvailablePhysicalMemory =
        (ap + buffersMem + cachedMem) >> 10 >> 10;
    } else {
      std::cout << "Problem parsing /proc/meminfo" << std::endl;
      fclose(fd);
      return false;
    }
  }
  fclose(fd);

  return true;
#else
  return false;
#endif
}